

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall xLearn::Reader::~Reader(Reader *this)

{
  DMatrix *in_RDI;
  
  in_RDI->hash_value_1 = (uint64)&PTR__Reader_001c0ee0;
  std::__cxx11::string::~string
            ((string *)
             &in_RDI[1].Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish);
  DMatrix::~DMatrix(in_RDI);
  std::__cxx11::string::~string((string *)&in_RDI->hash_value_2);
  return;
}

Assistant:

virtual ~Reader() {  }